

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recog_intel.c
# Opt level: O2

cpu_purpose_t cpuid_identify_purpose_intel(cpu_raw_data_t *raw)

{
  uint uVar1;
  cpu_purpose_t cVar2;
  
  cVar2 = PURPOSE_GENERAL;
  if ((*(byte *)((long)raw->basic_cpuid[7] + 0xd) & 0x80) != 0) {
    debugf(3,"Detected Intel CPU hybrid architecture\n");
    uVar1 = raw->basic_cpuid[0x1a][0] >> 0x18;
    if (uVar1 == 0x40) {
      cVar2 = PURPOSE_PERFORMANCE;
    }
    else if (uVar1 == 0x20) {
      cVar2 = (raw->intel_fn4[3][0] == 0) + PURPOSE_EFFICIENCY;
    }
    else {
      cVar2 = PURPOSE_GENERAL;
    }
  }
  return cVar2;
}

Assistant:

cpu_purpose_t cpuid_identify_purpose_intel(struct cpu_raw_data_t* raw)
{
	/* Check for hybrid architecture
	From Intel® 64 and IA-32 Architectures Software Developer’s Manual Combined Volumes: 1, 2A, 2B, 2C, 2D, 3A, 3B, 3C, 3D, and 4
	Available at https://cdrdv2.intel.com/v1/dl/getContent/671200

	- CPUID[7h] is Structured Extended Feature Flags Enumeration Leaf (Output depends on ECX input value)
	  EDX, bit 15: Hybrid. If 1, the processor is identified as a hybrid part.

	- CPUID[1Ah] is Hybrid Information Enumeration Leaf (EAX = 1AH, ECX = 0)
	  EAX, bits 31-24: Core type
	*/
	if (EXTRACTS_BIT(raw->basic_cpuid[0x7][EDX], 15) == 0x1) {
		debugf(3, "Detected Intel CPU hybrid architecture\n");
		switch (EXTRACTS_BITS(raw->basic_cpuid[0x1a][EAX], 31, 24)) {
			case 0x20: /* Atom */
				/* Acccording to Ramyer M. from Intel, LP E-Cores do not have a L3 cache
				   https://community.intel.com/t5/Processors/Detecting-LP-E-Cores-on-Meteor-Lake-in-software/m-p/1584555/highlight/true#M70732
				   If sub-leaf 3 is set, it is an E-Cores.
				*/
				return (EXTRACTS_BITS(raw->intel_fn4[3][EAX], 31, 0)) ? PURPOSE_EFFICIENCY : PURPOSE_LP_EFFICIENCY;
			case 0x40: /* Core */
				return PURPOSE_PERFORMANCE;
			default:
				return PURPOSE_GENERAL;
		}
	}

	return PURPOSE_GENERAL;
}